

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_type.cpp
# Opt level: O0

ExpressionType duckdb::FlipComparisonExpression(ExpressionType type)

{
  string *msg;
  ExpressionType in_DIL;
  ExpressionType flipped_type;
  allocator *this;
  allocator local_29;
  string local_28 [38];
  ExpressionType local_2;
  
  local_2 = 0;
  switch(in_DIL) {
  case COMPARE_BOUNDARY_START:
  case COMPARE_NOTEQUAL:
  case COMPARE_DISTINCT_FROM:
  case COMPARE_BOUNDARY_END:
    local_2 = in_DIL;
    break;
  case COMPARE_LESSTHAN:
    local_2 = COMPARE_GREATERTHAN;
    break;
  case COMPARE_GREATERTHAN:
    local_2 = COMPARE_LESSTHAN;
    break;
  case COMPARE_LESSTHANOREQUALTO:
    local_2 = COMPARE_GREATERTHANOREQUALTO;
    break;
  case COMPARE_GREATERTHANOREQUALTO:
    local_2 = COMPARE_LESSTHANOREQUALTO;
    break;
  default:
    msg = (string *)__cxa_allocate_exception(0x10);
    this = &local_29;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_28,"Unsupported comparison type in flip",this);
    InternalException::InternalException((InternalException *)this,msg);
    __cxa_throw(msg,&InternalException::typeinfo,InternalException::~InternalException);
  }
  return local_2;
}

Assistant:

ExpressionType FlipComparisonExpression(ExpressionType type) {
	ExpressionType flipped_type = ExpressionType::INVALID;
	switch (type) {
	case ExpressionType::COMPARE_NOT_DISTINCT_FROM:
	case ExpressionType::COMPARE_DISTINCT_FROM:
	case ExpressionType::COMPARE_NOTEQUAL:
	case ExpressionType::COMPARE_EQUAL:
		flipped_type = type;
		break;
	case ExpressionType::COMPARE_LESSTHAN:
		flipped_type = ExpressionType::COMPARE_GREATERTHAN;
		break;
	case ExpressionType::COMPARE_GREATERTHAN:
		flipped_type = ExpressionType::COMPARE_LESSTHAN;
		break;
	case ExpressionType::COMPARE_LESSTHANOREQUALTO:
		flipped_type = ExpressionType::COMPARE_GREATERTHANOREQUALTO;
		break;
	case ExpressionType::COMPARE_GREATERTHANOREQUALTO:
		flipped_type = ExpressionType::COMPARE_LESSTHANOREQUALTO;
		break;
	default:
		throw InternalException("Unsupported comparison type in flip");
	}
	return flipped_type;
}